

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O1

CSVRow * __thiscall
csv::internals::ThreadSafeDeque<csv::CSVRow>::pop_front
          (CSVRow *__return_storage_ptr__,ThreadSafeDeque<csv::CSVRow> *this)

{
  _Elt_pointer pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  int iVar4;
  undefined8 uVar5;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
  if (iVar4 == 0) {
    pCVar1 = (this->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    (__return_storage_ptr__->data).
    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pCVar1->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    (__return_storage_ptr__->data).
    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (pCVar1->data).
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (pCVar1->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->data).
    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
    (pCVar1->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    __return_storage_ptr__->row_length = pCVar1->row_length;
    sVar3 = pCVar1->fields_start;
    __return_storage_ptr__->data_start = pCVar1->data_start;
    __return_storage_ptr__->fields_start = sVar3;
    std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::pop_front(&this->data);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
    return __return_storage_ptr__;
  }
  uVar5 = std::__throw_system_error(iVar4);
  __clang_call_terminate(uVar5);
}

Assistant:

T pop_front() noexcept {
                std::lock_guard<std::mutex> lock{ this->_lock };
                T item = std::move(data.front());
                data.pop_front();
                return item;
            }